

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void TPZSkylMatrix<double>::ComputeMaxSkyline
               (TPZSkylMatrix<double> *first,TPZSkylMatrix<double> *second,TPZVec<long> *res)

{
  int64_t iVar1;
  int64_t iVar2;
  long lVar3;
  long *plVar4;
  TPZVec<long> *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  int64_t aux;
  int64_t dim;
  int64_t i;
  int64_t in_stack_ffffffffffffffb8;
  TPZSkylMatrix<double> *in_stack_ffffffffffffffc0;
  long local_20;
  
  iVar1 = TPZBaseMatrix::Rows(in_RDI);
  iVar2 = TPZBaseMatrix::Rows(in_RSI);
  if (iVar1 == iVar2) {
    iVar1 = TPZBaseMatrix::Rows(in_RDI);
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,iVar1 + 1);
    for (local_20 = 1; local_20 < iVar1 + 1; local_20 = local_20 + 1) {
      in_stack_ffffffffffffffc0 =
           (TPZSkylMatrix<double> *)Size(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      iVar2 = Size(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if (iVar2 < (long)in_stack_ffffffffffffffc0) {
        in_stack_ffffffffffffffb8 = Size(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      else {
        in_stack_ffffffffffffffb8 = Size(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      lVar3 = local_20 - in_stack_ffffffffffffffb8;
      plVar4 = TPZVec<long>::operator[](in_RDX,local_20);
      *plVar4 = lVar3 + -1;
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"ComputeMaxSkyline : incompatible dimension");
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::ComputeMaxSkyline(const TPZSkylMatrix<TVar> &first, const TPZSkylMatrix<TVar> &second, TPZVec<int64_t> &res) {
	
	if (first.Rows() != second.Rows()) {
		cout<<"ComputeMaxSkyline : incompatible dimension";
		return;
	}
	int64_t i, dim = first.Rows();
	res.Resize(dim+1);
	
	for(i=1; i<dim+1; i++) {
		
		int64_t aux = ( first.Size(i) > second.Size(i) ) ? first.Size(i) : second.Size(i);
		res[i] = i-aux-1;
	}
}